

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O3

void __thiscall
BailOutRecord::RestoreValue
          (BailOutRecord *this,BailOutKind bailOutKind,JavascriptCallStackLayout *layout,Var *values
          ,ScriptContext *scriptContext,bool fromLoopBody,Var *registerSaves,
          InterpreterStackFrame *newInstance,Var *pArgumentsObject,void *argoutRestoreAddress,
          uint regSlot,int offset,bool isLocal,bool isFloat64,bool isInt32)

{
  IRType IVar1;
  Utf8SourceInfo *pUVar2;
  code *pcVar3;
  bool bVar4;
  RegNum RVar5;
  uint uVar6;
  uint uVar7;
  int32 iVar8;
  RegSlot RVar9;
  LocalFunctionId LVar10;
  FunctionBody *pFVar11;
  undefined4 *puVar12;
  Var instance;
  FunctionInfo *pFVar13;
  undefined4 extraout_var;
  uint64 uVar14;
  uint64 uVar15;
  JavascriptCallStackLayout *extraout_RDX;
  JavascriptCallStackLayout *extraout_RDX_00;
  JavascriptCallStackLayout *extraout_RDX_01;
  JavascriptCallStackLayout *extraout_RDX_02;
  JavascriptCallStackLayout *layout_00;
  Var pvVar16;
  char16 *form;
  ulong uVar17;
  char16_t *pcVar18;
  byte bVar19;
  Var local_58;
  ulong local_50;
  
  pcVar18 = L"OutParam";
  if (isLocal) {
    pcVar18 = L"Register";
  }
  if (DAT_015bc46a == '\x01') {
    pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
    pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
    pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar13 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar4) goto LAB_003f9ee5;
      *puVar12 = 0;
      pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
    if ((bVar4) &&
       ((DAT_015bf388 == DAT_015bf390 ||
        (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)))) {
      Output::Print(L"BailOut:   %s #%3d: ",pcVar18,(ulong)regSlot);
    }
  }
  if (offset < 0) {
    if (argoutRestoreAddress == (void *)0x0) {
      if (isFloat64) {
        local_58 = (Var)Js::JavascriptCallStackLayout::GetDoubleAtOffset(layout,offset);
        local_50 = 0;
      }
      else {
        if (!isInt32) {
          instance = Js::JavascriptCallStackLayout::GetOffset(layout,offset);
          pFVar11 = Js::JavascriptFunction::GetFunctionBody
                              (*(JavascriptFunction **)(newInstance + 0x80));
          pUVar2 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
          bVar19 = pUVar2->field_0xa8;
          local_50 = 0;
          local_58 = (Var)0x0;
          if ((byte)((bVar19 & 0x40) >> 6 &
                    (bVar19 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0)) == 1) {
            pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            bVar4 = Js::FunctionBody::IsNonTempLocalVar(pFVar11,regSlot);
            if ((instance == (Var)0xcececececececece) && (bVar4)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar12 = 1;
              bVar4 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                                 ,0x379,
                                 "(!(newInstance->function->GetFunctionBody()->IsInDebugMode() && newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) && value == (Js::Var)Func::c_debugFillPattern))"
                                 ,
                                 "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code."
                                );
              goto joined_r0x003f9d1c;
            }
          }
          goto LAB_003f9205;
        }
        iVar8 = Js::JavascriptCallStackLayout::GetInt32AtOffset(layout,offset);
        local_50 = CONCAT44(extraout_var,iVar8);
        local_58 = (Var)0x0;
      }
LAB_003f9203:
      instance = (Var)0x0;
    }
    else {
      local_50 = 0;
      local_58 = (Var)0x0;
      if (isLocal) goto LAB_003f9203;
      if (isFloat64 || isInt32) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,900,"(!isFloat64 && !isInt32)","!isFloat64 && !isInt32");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
      }
      instance = *(Var *)((long)argoutRestoreAddress + (ulong)(regSlot * 8));
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      pUVar2 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr;
      bVar19 = pUVar2->field_0xa8;
      if ((byte)((bVar19 & 0x40) >> 6 &
                (bVar19 >> 5 | (pUVar2->debugModeSource).ptr != (uchar *)0x0)) == 1) {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        bVar4 = Js::FunctionBody::IsNonTempLocalVar(pFVar11,regSlot);
        if (instance == (Var)0xcececececececece && bVar4) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x38a,
                             "(!(newInstance->function->GetFunctionBody()->IsInDebugMode() && newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) && value == (Js::Var)Func::c_debugFillPattern))"
                             ,
                             "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code."
                            );
joined_r0x003f9d1c:
          if (!bVar4) goto LAB_003f9ee5;
          local_50 = 0;
          local_58 = (Var)0x0;
          instance = (Var)0xcececececececece;
          *puVar12 = 0;
        }
      }
    }
LAB_003f9205:
    if (DAT_015bc46a == '\x01') {
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar13 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
      if ((bVar4) &&
         ((DAT_015bf388 == DAT_015bf390 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)))) {
        pcVar18 = L"Stack offset %6d";
        uVar17 = (ulong)(uint)offset;
LAB_003f9301:
        Output::Print(pcVar18,uVar17);
      }
    }
LAB_003f9311:
    if (isFloat64) goto LAB_003f931b;
    bVar19 = (byte)((uint)offset >> 0x1f);
LAB_003f94e7:
    if (isInt32) {
      if (instance != (void *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x3de,"(!value)","!value");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
      }
      pvVar16 = (Var)(local_50 & 0xffffffff | 0x1000000000000);
      if (DAT_015bc46a == '\x01') {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar13 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
          pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
        if ((bVar4) &&
           ((DAT_015bf388 == DAT_015bf390 ||
            (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)))) {
          Output::Print(L", value: %10d (ToVar: 0x%p)",local_50,pvVar16);
        }
      }
    }
    else {
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      RVar9 = Js::FunctionBody::GetYieldRegister(pFVar11);
      pvVar16 = instance;
      if (RVar9 == regSlot) {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar13 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
          pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        if ((FunctionBody *)(pFVar13->functionBodyImpl).ptr != pFVar11) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                             "GetFunctionInfo()->GetFunctionProxy() == this");
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
          pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        if ((pFVar13->attributes & (Async|Generator)) != None) {
          if (instance == (void *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar12 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                               ,0x3e6,"(value)","value");
            if (!bVar4) goto LAB_003f9ee5;
            *puVar12 = 0;
          }
          bVar4 = ThreadContext::IsOnStack(instance);
          if (bVar4) {
            if (DAT_015bc46a != '\0') {
              pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                  (*(JavascriptFunction **)(newInstance + 0x80));
              uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
              pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                  (*(JavascriptFunction **)(newInstance + 0x80));
              LVar10 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
              bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar6,LVar10);
              if ((bVar4) &&
                 ((DAT_015bf388 == DAT_015bf390 ||
                  (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)))
                 ) {
                pcVar18 = L", value: 0x%p (Resume Yield Object)";
LAB_003f9db3:
                Output::Print(pcVar18,instance);
              }
            }
          }
          else if (DAT_015bc46a != '\0') {
            pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
            pFVar11 = Js::JavascriptFunction::GetFunctionBody
                                (*(JavascriptFunction **)(newInstance + 0x80));
            LVar10 = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar11);
            bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar6,LVar10);
            if ((bVar4) &&
               ((DAT_015bf388 == DAT_015bf390 ||
                (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4))))
            {
              pcVar18 = L", value: 0x%p (Yield Return Value)";
              goto LAB_003f9db3;
            }
          }
          goto LAB_003f9dcd;
        }
      }
      if (DAT_015bc46a == '\x01') {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar13 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
          pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
        if ((bVar4) &&
           ((DAT_015bf388 == DAT_015bf390 ||
            (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)))) {
          Output::Print(L", value: 0x%p",instance);
        }
      }
      if (((bVar19 != 0) &&
          (pvVar16 = Js::JavascriptOperators::BoxStackInstance(instance,scriptContext,true,false),
          instance != pvVar16)) && (DAT_015bc46a == '\x01')) {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar13 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
          pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
        if ((bVar4) &&
           ((DAT_015bf388 == DAT_015bf390 ||
            (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)))) {
          Output::Print(L" (Boxed: 0x%p)",pvVar16);
        }
      }
    }
  }
  else {
    if (offset == 0) {
      if (DAT_015bc46a != '\x01') {
        return;
      }
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar13 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
      if (!bVar4) {
        return;
      }
      form = L"Not live\n";
      goto LAB_003f9e9c;
    }
    uVar6 = GetBailOutRegisterSaveSlotCount();
    if (uVar6 < (uint)offset) {
      uVar6 = GetBailOutRegisterSaveSlotCount();
      uVar7 = GetBailOutReserveSlotCount();
      if (uVar7 + uVar6 != offset) {
        uVar6 = GetBailOutRegisterSaveSlotCount();
        uVar7 = GetBailOutReserveSlotCount();
        uVar17 = (ulong)(~(uVar7 + uVar6) + offset);
        instance = this->constants[uVar17];
        local_50 = 0;
        if (isInt32) {
          local_50 = (ulong)instance & 0xffffffff;
          instance = (Var)0x0;
        }
        local_58 = (Var)0x0;
        if (DAT_015bc46a != '\x01') goto LAB_003f9311;
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar13 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
          pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
        if ((!bVar4) ||
           ((DAT_015bf388 != DAT_015bf390 &&
            (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), !bVar4))))
        goto LAB_003f9311;
        pcVar18 = L"Constant index %4d";
        goto LAB_003f9301;
      }
      layout_00 = extraout_RDX;
      if (isFloat64) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x3b4,"(!isFloat64)","!isFloat64");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
        layout_00 = extraout_RDX_00;
      }
      if (isInt32) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x3b5,"(!isInt32)","!isInt32");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
        layout_00 = extraout_RDX_01;
      }
      if (fromLoopBody) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x3b6,"(!fromLoopBody)","!fromLoopBody");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
        layout_00 = extraout_RDX_02;
      }
      instance = *pArgumentsObject;
      if ((instance == (Var)0x0) &&
         (instance = EnsureArguments(this,newInstance,layout_00,scriptContext,pArgumentsObject),
         instance == (Var)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x3bc,"(value)","value");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
        instance = (Var)0x0;
      }
      local_50 = 0;
      local_58 = (Var)0x0;
      if (DAT_015bc46a == '\x01') {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar13 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
          pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
        if ((bVar4) &&
           ((DAT_015bf388 == DAT_015bf390 ||
            (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)))) {
          local_50 = 0;
          Output::Print(L"Arguments object");
        }
      }
      goto LAB_003f9311;
    }
    if (registerSaves == (Var *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x396,"(registerSaves)","registerSaves");
      if (!bVar4) goto LAB_003f9ee5;
      *puVar12 = 0;
    }
    RVar5 = LinearScanMD::GetRegisterFromSaveIndex(offset);
    IVar1 = RegTypes[RVar5];
    if (!isFloat64) {
      if (isInt32) {
        if (IVar1 == TyFloat64) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x3a6,
                             "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                             ,
                             "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                            );
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
        }
        local_50 = (ulong)*(uint *)(registerSaves + ((ulong)(uint)offset - 1));
        instance = (void *)0x0;
      }
      else {
        if (IVar1 == TyFloat64) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x3ab,
                             "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64)"
                             ,
                             "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64"
                            );
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
        }
        instance = registerSaves[(ulong)(uint)offset - 1];
        local_50 = 0;
      }
      bVar19 = 1;
      if (DAT_015bc46a == '\x01') {
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
        pFVar11 = Js::JavascriptFunction::GetFunctionBody
                            (*(JavascriptFunction **)(newInstance + 0x80));
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        if (pFVar13 == (FunctionInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar12 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                             ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
          if (!bVar4) goto LAB_003f9ee5;
          *puVar12 = 0;
          pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
        }
        bVar4 = Js::Phases::IsEnabled
                          ((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
        if (bVar4) {
          bVar19 = 1;
          if ((DAT_015bf388 == DAT_015bf390) ||
             (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)) {
            RVar5 = LinearScanMD::GetRegisterFromSaveIndex(offset);
            Output::Print(L"Register %-4S  %4d",RegNames[RVar5],(ulong)(uint)offset);
          }
        }
        else {
          bVar19 = 1;
        }
      }
      goto LAB_003f94e7;
    }
    if (IVar1 != TyFloat64) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x39a,
                         "(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64)",
                         "RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64");
      if (!bVar4) goto LAB_003f9ee5;
      *puVar12 = 0;
    }
    local_58 = registerSaves[(ulong)(uint)offset - 1];
    if (DAT_015bc46a == '\x01') {
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar13 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
      if ((bVar4) &&
         ((DAT_015bf388 == DAT_015bf390 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)))) {
        RVar5 = LinearScanMD::GetRegisterFromSaveIndex(offset);
        Output::Print(L"Register %-4S  %4d",RegNames[RVar5],(ulong)(uint)offset);
      }
    }
LAB_003f931b:
    uVar14 = Js::NumberUtilities::ToSpecial((double)local_58);
    bVar4 = Js::NumberUtilities::IsNan((double)local_58);
    if (((bVar4) &&
        (uVar15 = Js::NumberUtilities::ToSpecial((double)local_58), uVar15 != 0xfff8000000000000))
       && (uVar15 = Js::NumberUtilities::ToSpecial((double)local_58), uVar15 != 0x7ff8000000000000))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Library/JavascriptNumber.inl"
                         ,0xa2,
                         "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                         ,"We should only produce a NaN with this value");
      if (!bVar4) goto LAB_003f9ee5;
      *puVar12 = 0;
    }
    pvVar16 = (Var)(uVar14 ^ 0xfffc000000000000);
    if (DAT_015bc46a == '\x01') {
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
      pFVar11 = Js::JavascriptFunction::GetFunctionBody
                          (*(JavascriptFunction **)(newInstance + 0x80));
      pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      if (pFVar13 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                           ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar4) goto LAB_003f9ee5;
        *puVar12 = 0;
        pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
      }
      bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
      if ((bVar4) &&
         ((DAT_015bf388 == DAT_015bf390 ||
          (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), bVar4)))) {
        Output::Print(L", value: %f (ToVar: 0x%p)",local_58,pvVar16);
      }
    }
  }
LAB_003f9dcd:
  values[regSlot] = pvVar16;
  if (DAT_015bc46a != '\x01') {
    return;
  }
  pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
  uVar6 = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar11);
  pFVar11 = Js::JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)(newInstance + 0x80));
  pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar13 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                       ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
LAB_003f9ee5:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar12 = 0;
    pFVar13 = (pFVar11->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BailOutPhase,uVar6,pFVar13->functionId);
  if (!bVar4) {
    return;
  }
  form = L"\n";
LAB_003f9e9c:
  if ((DAT_015bf388 != DAT_015bf390) &&
     (bVar4 = Js::NumberSet::Contains((NumberSet *)&DAT_015bf368,bailOutKind), !bVar4)) {
    return;
  }
  Output::Print(form);
  return;
}

Assistant:

void
BailOutRecord::RestoreValue(IR::BailOutKind bailOutKind, Js::JavascriptCallStackLayout * layout, Js::Var * values, Js::ScriptContext * scriptContext,
    bool fromLoopBody, Js::Var * registerSaves, Js::InterpreterStackFrame * newInstance, Js::Var* pArgumentsObject, void * argoutRestoreAddress,
    uint regSlot, int offset, bool isLocal, bool isFloat64, bool isInt32) const
{
    bool boxStackInstance = true;
    Js::Var value = 0;
    double dblValue = 0.0;
    int32 int32Value = 0;

#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 const * name = _u("OutParam");
    if (isLocal)
    {
        name = _u("Register");
    }
#endif

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("BailOut:   %s #%3d: "), name, regSlot);

    if (offset < 0)
    {
        // Stack offset are negative
        if (!argoutRestoreAddress)
        {
            if (isFloat64)
            {
                dblValue = layout->GetDoubleAtOffset(offset);
            }
            else if (isInt32)
            {
                int32Value = layout->GetInt32AtOffset(offset);
            }
            else
            {
                value = layout->GetOffset(offset);
                AssertMsg(!(newInstance->function->GetFunctionBody()->IsInDebugMode() &&
                    newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) &&
                    value == (Js::Var)Func::c_debugFillPattern),
                    "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code.");
            }
        }
        else if (!isLocal)
        {
            // If we have:
            // try {
            //      bar(a, b, c);
            // } catch(..) {..}
            // and we bailout during bar args evaluation, we recover from args from argoutRestoreAddress, not from caller function frame.
            // This is because try-catch is implemented as a C wrapper, so args will be a different offset from rbp in that case.
            Assert(!isFloat64 && !isInt32);

            value = *((Js::Var *)(((char *)argoutRestoreAddress) + regSlot * MachPtr));
            AssertMsg(!(newInstance->function->GetFunctionBody()->IsInDebugMode() &&
                newInstance->function->GetFunctionBody()->IsNonTempLocalVar(regSlot) &&
                value == (Js::Var)Func::c_debugFillPattern),
                "Uninitialized value (debug mode only)? Try -trace:bailout -verbose and check last traced reg in byte code.");

        }

        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Stack offset %6d"), offset);
    }
    else if (offset > 0)
    {
        if ((uint)offset <= GetBailOutRegisterSaveSlotCount())
        {
            // Register save space (offset is the register number and index into the register save space)
            // Index is one based, so subtract one
            AssertOrFailFast(registerSaves);

            if (isFloat64)
            {
                Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] == TyFloat64);
                dblValue = *((double*)&(registerSaves[offset - 1]));
#ifdef _M_ARM
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[(offset - RegD0) / 2 + RegD0], offset);
#else
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[LinearScanMD::GetRegisterFromSaveIndex(offset)], offset);
#endif
            }
            else
            {
                if (isInt32)
                {
                    Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                    int32Value = ::Math::PointerCastToIntegralTruncate<int32>(registerSaves[offset - 1]);
                }
                else
                {
                    Assert(RegTypes[LinearScanMD::GetRegisterFromSaveIndex(offset)] != TyFloat64);
                    value = registerSaves[offset - 1];
                }

                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Register %-4S  %4d"), RegNames[LinearScanMD::GetRegisterFromSaveIndex(offset)], offset);
            }
        }
        else if (BailOutRecord::IsArgumentsObject((uint)offset))
        {
            Assert(!isFloat64);
            Assert(!isInt32);
            Assert(!fromLoopBody);
            value = *pArgumentsObject;
            if (value == nullptr)
            {
                value = EnsureArguments(newInstance, layout, scriptContext, pArgumentsObject);
            }
            Assert(value);
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Arguments object"));
            boxStackInstance = false;
        }
        else
        {
            // Constants offset starts from max bail out register save slot count;
            uint constantIndex = offset - (GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount()) - 1;
            if (isInt32)
            {
                int32Value = ::Math::PointerCastToIntegralTruncate<int32>(this->constants[constantIndex]);
            }
            else
            {
                value = this->constants[constantIndex];
            }
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Constant index %4d"), constantIndex);
            boxStackInstance = false;
        }
    }
    else
    {
        // Consider Assert(false) here
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("Not live\n"));
        return;
    }

    if (isFloat64)
    {
        value = Js::JavascriptNumber::New(dblValue, scriptContext);
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: %f (ToVar: 0x%p)"), dblValue, value);
    }
    else if (isInt32)
    {
        Assert(!value);
        value = Js::JavascriptNumber::ToVar(int32Value, scriptContext);
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: %10d (ToVar: 0x%p)"), int32Value, value);
    }
    else if (regSlot == newInstance->function->GetFunctionBody()->GetYieldRegister() && newInstance->function->GetFunctionBody()->IsCoroutine())
    {
        // This value can only either be a resume yield object created on the heap or
        // an iterator result object created on the heap. No need to box either.
        Assert(value);

#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (ThreadContext::IsOnStack(value))
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p (Resume Yield Object)"), value);
        }
        else
        {
            BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p (Yield Return Value)"), value);
        }
#endif
    }
    else
    {
        BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(", value: 0x%p"), value);
        if (boxStackInstance)
        {
            Js::Var oldValue = value;
            value = Js::JavascriptOperators::BoxStackInstance(oldValue, scriptContext, /* allowStackFunction */ true, /* deepCopy */ false);

            if (oldValue != value)
            {
                BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u(" (Boxed: 0x%p)"), value);
            }
        }
    }

    values[regSlot] = value;

    BAILOUT_VERBOSE_TRACE(newInstance->function->GetFunctionBody(), bailOutKind, _u("\n"));
}